

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int lj_cf_table_sort(lua_State *L)

{
  MSize u;
  GCtab *t;
  
  t = lj_lib_checktab(L,1);
  u = lj_tab_len(t);
  lua_settop(L,2);
  if (L->base[1].u64 != 0xffffffffffffffff) {
    lj_lib_checkfunc(L,2);
  }
  auxsort(L,1,u);
  return 0;
}

Assistant:

LJLIB_CF(table_sort)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n = (int32_t)lj_tab_len(t);
  lua_settop(L, 2);
  if (!tvisnil(L->base+1))
    lj_lib_checkfunc(L, 2);
  auxsort(L, 1, n);
  return 0;
}